

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_font_renderer.cpp
# Opt level: O0

char * __thiscall StbFontRendererCreator::getDescription(StbFontRendererCreator *this)

{
  StbFontRendererCreator *this_local;
  
  return "stb_truetype.h 1.24 (https://github.com/nothings/stb)";
}

Assistant:

const char* getDescription() const override
    {
        return (
            "stb_truetype.h "
            // STB_TRUETYPE_H_VERSION is our custom macro created
            // by parsing stb_truetype.h in CMakeLists.txt.
            #ifdef STB_TRUETYPE_H_VERSION
            STB_TRUETYPE_H_VERSION " "
            #endif
            "(https://github.com/nothings/stb)");
    }